

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

char * sx_os_path_pwd(char *dst,int size)

{
  char *pcVar1;
  
  pcVar1 = getcwd(dst,(long)size);
  return pcVar1;
}

Assistant:

char* sx_os_path_pwd(char* dst, int size)
{
#if SX_PLATFORM_PS4 || SX_PLATFORM_XBOXONE || SX_PLATFORM_WINRT || SX_CRT_NONE
    sx_unused(dst);
    sx_unused(size);
    return NULL;
#elif SX_CRT_MSVC
    return _getcwd(dst, size);
#else
    return getcwd(dst, size);
#endif    // SX_COMPILER_
}